

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O2

optional<yactfr::ByteOrder> __thiscall yactfr::internal::TsdlAttr::_toBo(TsdlAttr *this)

{
  string *__lhs;
  string msg;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined8 in_stack_fffffffffffffe30;
  TextLocation in_stack_fffffffffffffe38;
  TextLocation local_1a8;
  ostringstream ss;
  
  __lhs = &this->strVal;
  bVar1 = std::operator==(__lhs,"be");
  uVar4 = 1;
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,"network");
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"le");
      if (bVar1) {
        uVar2 = 0x100000000;
        goto LAB_0029cc64;
      }
      bVar1 = std::operator==(__lhs,"native");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Invalid byte order `");
        poVar3 = std::operator<<(poVar3,(string *)__lhs);
        std::operator<<(poVar3,"`.");
        std::__cxx11::stringbuf::str();
        valTextLoc(&local_1a8,this);
        msg._M_string_length = local_1a8._lineNumber;
        msg._M_dataplus._M_p = (pointer)local_1a8._offset;
        msg.field_2._M_allocated_capacity = local_1a8._colNumber;
        msg.field_2._8_8_ = in_stack_fffffffffffffe30;
        throwTextParseError(msg,in_stack_fffffffffffffe38);
      }
      uVar4 = 0;
    }
  }
  uVar2 = 0;
LAB_0029cc64:
  return (optional<yactfr::ByteOrder>)(type)(uVar4 | uVar2);
}

Assistant:

boost::optional<ByteOrder> TsdlAttr::_toBo() const
{
    if (strVal == "be" || strVal == "network") {
        return ByteOrder::Big;
    } else if (strVal == "le") {
        return ByteOrder::Little;
    } else if (strVal == "native") {
        return boost::none;
    }

    std::ostringstream ss;

    ss << "Invalid byte order `" << strVal << "`.";
    throwTextParseError(ss.str(), this->valTextLoc());
}